

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

Expression __thiscall
dynet::expr::contract3d_1d(expr *this,Expression *x,Expression *y,Expression *b)

{
  pointer *pppNVar1;
  ComputationGraph *this_00;
  iterator __position;
  Node *pNVar2;
  undefined8 extraout_RDX;
  Expression EVar3;
  initializer_list<dynet::VariableIndex> __l;
  allocator_type local_3d;
  VariableIndex local_3c;
  Node *local_38;
  VariableIndex local_2c;
  uint local_28;
  uint local_24;
  
  local_2c.t = (x->i).t;
  this_00 = x->pg;
  local_28 = (y->i).t;
  local_24 = (b->i).t;
  local_3c.t = (uint)((ulong)((long)(this_00->nodes).
                                    super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_00->nodes).
                                   super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
  pNVar2 = (Node *)operator_new(0x58);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_005a55e8;
  __l._M_len = 3;
  __l._M_array = &local_2c;
  std::vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>::vector
            (&pNVar2->args,__l,&local_3d);
  (pNVar2->dim).nd = 0;
  (pNVar2->dim).bd = 1;
  pNVar2->device = dynet::default_device;
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_005ac528;
  __position._M_current =
       (this_00->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = pNVar2;
  if (__position._M_current ==
      (this_00->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this_00,__position,&local_38);
  }
  else {
    *__position._M_current = pNVar2;
    pppNVar1 = &(this_00->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  ComputationGraph::set_dim_for_new_node(this_00,&local_3c);
  *(ComputationGraph **)this = this_00;
  *(uint *)(this + 8) = local_3c.t;
  EVar3._8_8_ = extraout_RDX;
  EVar3.pg = (ComputationGraph *)this;
  return EVar3;
}

Assistant:

Expression contract3d_1d(const Expression& x, const Expression& y, const Expression& b) { return Expression(x.pg, x.pg->add_function<InnerProduct3D_1D>({x.i, y.i, b.i})); }